

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O1

QSizeF __thiscall QGridLayoutItem::effectiveMaxSize(QGridLayoutItem *this,QSizeF *constraint)

{
  QSizeF QVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  qreal extraout_XMM0_Qa_00;
  qreal in_XMM1_Qa;
  qreal qVar4;
  qreal local_38;
  qreal qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = constraint->wd;
  qStack_30 = constraint->ht;
  uVar2 = (*this->_vptr_QGridLayoutItem[2])(this,2);
  uVar3 = (*this->_vptr_QGridLayoutItem[2])(this,1);
  if ((uVar2 & uVar3 & 1) == 0) {
    (*this->_vptr_QGridLayoutItem[3])(this,1,constraint);
    if ((uVar2 & 1) == 0) {
      qStack_30 = in_XMM1_Qa;
    }
    if ((uVar3 & 1) == 0) {
      local_38 = extraout_XMM0_Qa;
    }
  }
  qVar4 = local_38;
  if ((local_38 < 0.0) || (qVar4 = qStack_30, qStack_30 < 0.0)) {
    (*this->_vptr_QGridLayoutItem[3])(this,2,&local_38);
    if ((local_38 == -1.0) && (!NAN(local_38))) {
      local_38 = extraout_XMM0_Qa_00;
    }
    if ((qStack_30 == -1.0) && (!NAN(qStack_30))) {
      qStack_30 = qVar4;
    }
  }
  QVar1.ht = qStack_30;
  QVar1.wd = local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGridLayoutItem::effectiveMaxSize(const QSizeF &constraint) const
{
    QSizeF size = constraint;
    bool vGrow = (sizePolicy(Qt::Vertical) & QLayoutPolicy::GrowFlag) == QLayoutPolicy::GrowFlag;
    bool hGrow = (sizePolicy(Qt::Horizontal) & QLayoutPolicy::GrowFlag) == QLayoutPolicy::GrowFlag;
    if (!vGrow || !hGrow) {
        QSizeF pref = sizeHint(Qt::PreferredSize, constraint);
        if (!vGrow)
            size.setHeight(pref.height());
        if (!hGrow)
            size.setWidth(pref.width());
    }

    if (!size.isValid()) {
        QSizeF maxSize = sizeHint(Qt::MaximumSize, size);
        if (size.width() == -1)
            size.setWidth(maxSize.width());
        if (size.height() == -1)
            size.setHeight(maxSize.height());
    }
    return size;
}